

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_CheckLongFail_Test::TestBody(TApp_CheckLongFail_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  AssertHelper local_88;
  Message local_80 [2];
  HorribleError *anon_var_0;
  char *pcStack_68;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  TApp_CheckLongFail_Test *this_local;
  
  gtest_msg.value._3_1_ = 1;
  local_48 = &local_40;
  local_10 = (undefined1  [8])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"-t",&local_49);
  gtest_msg.value._3_1_ = 0;
  local_20 = &local_40;
  local_18 = 1;
  __l._M_len = 1;
  __l._M_array = local_20;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_a8 = local_a8 + -1;
    std::__cxx11::string::~string((string *)local_a8);
  } while (local_a8 != &local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff98,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff98);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      anon_var_0._6_1_ = 1;
      CLI::detail::AppFriend::
      parse_arg<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool>
                (&(this->super_TApp).app,&(this->super_TApp).args,(bool *)((long)&anon_var_0 + 6));
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_68 = 
    "Expected: CLI::detail::AppFriend::parse_arg(&app, args, true) throws an exception of type CLI::HorribleError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_80);
  testing::internal::AssertHelper::AssertHelper
            (&local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x4f2,pcStack_68);
  testing::internal::AssertHelper::operator=(&local_88,local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  testing::Message::~Message(local_80);
  return;
}

Assistant:

TEST_F(TApp, CheckLongFail) {
    args = {"-t"};

    EXPECT_THROW(CLI::detail::AppFriend::parse_arg(&app, args, true), CLI::HorribleError);
}